

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id3.c
# Opt level: O0

unsigned_long id3_sync_safe(unsigned_long num)

{
  undefined4 local_1c;
  ulong uStack_18;
  int i;
  unsigned_long res;
  unsigned_long num_local;
  
  uStack_18 = 0;
  res = num;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    uStack_18 = (res & 0x7f) << ((byte)(local_1c << 3) & 0x3f) | uStack_18;
    res = res >> 7;
  }
  return uStack_18;
}

Assistant:

static unsigned long id3_sync_safe(unsigned long num) {
  unsigned long res = 0;
  int i;
  for (i = 0; i < 4; i++) {
    res |= (num & 0x7F) << (i * 8);
    num >>= 7;
  }
  return res;
}